

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCore.c
# Opt level: O2

Vec_Wec_t * Acec_MatchCopy(Vec_Wec_t *vLits,Vec_Int_t *vMap)

{
  int nCapMin;
  int iVar1;
  int iVar2;
  Vec_Wec_t *p;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  int i;
  int i_00;
  
  p = Vec_WecStart(vLits->nSize);
  iVar1 = 0;
  while (i_00 = iVar1, i_00 < vLits->nSize) {
    p_00 = Vec_WecEntry(vLits,i_00);
    iVar1 = i_00 + 1;
    for (i = 0; i < p_00->nSize; i = i + 1) {
      iVar2 = Vec_IntEntry(p_00,i);
      iVar2 = Abc_Lit2LitL(vMap->pArray,iVar2);
      if (p->nSize <= i_00) {
        nCapMin = p->nSize * 2;
        if (nCapMin <= iVar1) {
          nCapMin = iVar1;
        }
        Vec_WecGrow(p,nCapMin);
        p->nSize = iVar1;
      }
      p_01 = Vec_WecEntry(p,i_00);
      Vec_IntPush(p_01,iVar2);
    }
  }
  return p;
}

Assistant:

Vec_Wec_t * Acec_MatchCopy( Vec_Wec_t * vLits, Vec_Int_t * vMap )
{
    Vec_Wec_t * vRes = Vec_WecStart( Vec_WecSize(vLits) );
    Vec_Int_t * vLevel; int i, k, iLit;
    Vec_WecForEachLevel( vLits, vLevel, i )
        Vec_IntForEachEntry( vLevel, iLit, k )
            Vec_WecPush( vRes, i, Abc_Lit2LitL(Vec_IntArray(vMap), iLit) );
    return vRes;
}